

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  Lexer *pLVar1;
  Bool BVar2;
  TidyTagId TVar3;
  Dict *pDVar4;
  Node *pNVar5;
  uint code;
  ulong uVar6;
  Node *pNVar7;
  Node **ppNVar8;
  char *property;
  bool bVar9;
  bool bVar10;
  Node *lastli;
  
  if (list == (Node *)0x0) {
    bVar9 = false;
    pDVar4 = _DAT_00000038;
  }
  else {
    bVar9 = list->tag->id == TidyTag_OL;
    pDVar4 = list->tag;
  }
  if ((pDVar4->model & 1) != 0) {
    return;
  }
  pLVar1 = doc->lexer;
  pLVar1->insert = (IStack *)0x0;
LAB_0013f3c0:
  do {
    pNVar5 = prvTidyGetToken(doc,IgnoreWhitespace);
    if (pNVar5 == (Node *)0x0) {
      pNVar5 = (Node *)0x0;
      code = 0x25a;
LAB_0013f69c:
      prvTidyReport(doc,list,pNVar5,code);
      return;
    }
    if ((pNVar5->tag == list->tag) && (pNVar5->type == EndTag)) {
      prvTidyFreeNode(doc,pNVar5);
      list->closed = yes;
      return;
    }
    BVar2 = InsertMisc(list,pNVar5);
  } while (BVar2 != no);
  if (pNVar5->type == TextNode) {
    if (pLVar1 == (Lexer *)0x0) {
      pDVar4 = pNVar5->tag;
LAB_0013f480:
      if (pDVar4 == (Dict *)0x0) {
        if (bVar9) goto LAB_0013f4a5;
        bVar10 = false;
LAB_0013f53a:
        BVar2 = prvTidyIsHTML5Mode(doc);
        if ((BVar2 != no) && (!bVar10)) goto LAB_0013f648;
        prvTidyUngetToken(doc);
        BVar2 = prvTidynodeHasCM(pNVar5,8);
        if ((BVar2 != no) && (pLVar1->excludeBlocks != no)) {
          code = 0x259;
          goto LAB_0013f69c;
        }
        if (pLVar1->exiled != no) {
          BVar2 = prvTidynodeHasCM(pNVar5,0x380);
          if (BVar2 != no) {
            return;
          }
          if ((pNVar5->tag != (Dict *)0x0) && (pNVar5->tag->id == TidyTag_TABLE)) {
            return;
          }
        }
        if ((((list == (Node *)0x0) || (list->tag == (Dict *)0x0)) || (list->tag->id != TidyTag_OL))
           || (BVar2 = FindLastLI(list,&lastli), BVar2 == no)) {
          BVar2 = prvTidynodeHasCM(pNVar5,8);
          pNVar5 = prvTidyInferredTag(doc,TidyTag_LI);
          property = "list-style: none; display: inline";
          if (BVar2 == no) {
            property = "list-style: none";
          }
          prvTidyAddStyleProperty(doc,pNVar5,property);
          prvTidyReport(doc,list,pNVar5,0x261);
          goto LAB_0013f648;
        }
        pNVar5 = prvTidyInferredTag(doc,TidyTag_LI);
        prvTidyReport(doc,list,pNVar5,0x261);
        prvTidyFreeNode(doc,pNVar5);
        pNVar5 = lastli;
      }
      else {
        TVar3 = pDVar4->id;
        if ((bool)(bVar9 & TVar3 != TidyTag_LI)) {
LAB_0013f4a5:
          BVar2 = FindLastLI(list,&lastli);
          bVar10 = BVar2 != no;
          if (pDVar4 == (Dict *)0x0) goto LAB_0013f53a;
          TVar3 = pDVar4->id;
        }
        else {
          bVar10 = false;
        }
        if (TVar3 != TidyTag_LI) goto LAB_0013f53a;
LAB_0013f648:
        pNVar5->parent = list;
        pNVar7 = list->last;
        pNVar5->prev = pNVar7;
        ppNVar8 = &pNVar7->next;
        if (pNVar7 == (Node *)0x0) {
          ppNVar8 = &list->content;
        }
        *ppNVar8 = pNVar5;
        list->last = pNVar5;
      }
      ParseTag(doc,pNVar5,IgnoreWhitespace);
      goto LAB_0013f3c0;
    }
    for (uVar6 = (ulong)pNVar5->start; uVar6 < pNVar5->end; uVar6 = uVar6 + 1) {
      if ((0x20 < (ulong)(byte)pLVar1->lexbuf[uVar6]) ||
         ((0x100002600U >> ((ulong)(byte)pLVar1->lexbuf[uVar6] & 0x3f) & 1) == 0)) {
        pDVar4 = pNVar5->tag;
        goto LAB_0013f448;
      }
    }
  }
  else {
    pDVar4 = pNVar5->tag;
    if (pDVar4 != (Dict *)0x0) {
LAB_0013f448:
      if (pNVar5->type != EndTag) goto LAB_0013f480;
      if ((pDVar4 == (Dict *)0x0) || (pDVar4->id != TidyTag_FORM)) {
        BVar2 = prvTidynodeHasCM(pNVar5,0x10);
        pNVar7 = list;
        if (BVar2 != no) {
          prvTidyReport(doc,list,pNVar5,0x235);
          prvTidyPopInline(doc,pNVar5);
          goto LAB_0013f4fd;
        }
        while ((pNVar7 = pNVar7->parent, pNVar7 != (Node *)0x0 &&
               ((pDVar4 = pNVar7->tag, pDVar4 == (Dict *)0x0 || (pDVar4->id != TidyTag_BODY))))) {
          if (pNVar5->tag == pDVar4) {
            prvTidyReport(doc,list,pNVar5,0x259);
            prvTidyUngetToken(doc);
            return;
          }
        }
      }
      else {
        *(byte *)&doc->badForm = (byte)doc->badForm | 1;
      }
    }
    prvTidyReport(doc,list,pNVar5,0x235);
  }
LAB_0013f4fd:
  prvTidyFreeNode(doc,pNVar5);
  goto LAB_0013f3c0;
}

Assistant:

void TY_(ParseList)(TidyDocImpl* doc, Node *list, GetTokenMode ARG_UNUSED(mode))
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_list = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node, *parent, *lastli;
    Bool wasblock;
    Bool nodeisOL = nodeIsOL(list);

#if defined(ENABLE_DEBUG_LOG)
    in_parse_list++;
    SPRTF("Entering ParseList %d...\n",in_parse_list);
#endif
    if (list->tag->model & CM_EMPTY)
    {
#if defined(ENABLE_DEBUG_LOG)
        in_parse_list--;
        SPRTF("Exit ParseList 1 %d... CM_EMPTY\n",in_parse_list);
#endif
        return;
    }
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        Bool foundLI = no;
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
#if defined(ENABLE_DEBUG_LOG)
            in_parse_list--;
            SPRTF("Exit ParseList 2 %d... Endtag\n",in_parse_list);
#endif
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (node->type != TextNode && node->tag == NULL)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        if (lexer && (node->type == TextNode))
        {
            uint ch, ix = node->start;
            /* Issue #572 - Skip whitespace. */
            while (ix < node->end && (ch = (lexer->lexbuf[ix] & 0xff))
                && (ch == ' ' || ch == '\t' || ch == '\r' || ch == '\n'))
                ++ix;
            if (ix >= node->end)
            {
                /* Issue #572 - Discard if ALL whitespace. */
                TY_(FreeNode)(doc, node);
                continue;
            }
        }


        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            if (TY_(nodeHasCM)(node,CM_INLINE))
            {
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(PopInline)( doc, node );
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = list->parent;
                  parent != NULL; parent = parent->parent )
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1053626. */
                if (nodeIsBODY(parent))
                    break;
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                    TY_(UngetToken)( doc );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_list--;
                    SPRTF("Exit ParseList 3 %d... No End Tag\n",in_parse_list);
#endif
                    return;
                }
            }

            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsLI(node) && nodeisOL )
        {
            /* Issue #572 - A <ol><li> can have nested <ol> elements */
            foundLI = FindLastLI(list, &lastli); /* find last <li> */
        }

        if ( nodeIsLI(node) || (TY_(IsHTML5Mode)(doc) && !foundLI) )
        {
            /* node is <LI> OR
               Issue #396 - A <ul> can have Zero or more <li> elements
             */
            TY_(InsertNodeAtEnd)(list,node);
        }
        else
        {
            TY_(UngetToken)( doc );

            if (TY_(nodeHasCM)(node,CM_BLOCK) && lexer->excludeBlocks)
            {
                TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
#if defined(ENABLE_DEBUG_LOG)
                in_parse_list--;
                SPRTF("Exit ParseList 4 %d... No End Tag\n",in_parse_list);
#endif
                return;
            }
            /* http://tidy.sf.net/issue/1316307 */
            /* In exiled mode, return so table processing can continue. */
            else if ( lexer->exiled
                      && (TY_(nodeHasCM)(node, CM_TABLE|CM_ROWGRP|CM_ROW)
                          || nodeIsTABLE(node)) )
            {
#if defined(ENABLE_DEBUG_LOG)
                in_parse_list--;
                SPRTF("Exit ParseList 5 %d... exiled\n",in_parse_list);
#endif
                return;
            }
            /* http://tidy.sf.net/issue/836462
               If "list" is an unordered list, insert the next tag within 
               the last <li> to preserve the numbering to match the visual 
               rendering of most browsers. */    
            if ( nodeIsOL(list) && FindLastLI(list, &lastli) )
            {
                /* Create a node for error reporting */
                node = TY_(InferredTag)(doc, TidyTag_LI);
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(FreeNode)( doc, node);
                node = lastli;
            }
            else
            {
                /* Add an inferred <li> */
                wasblock = TY_(nodeHasCM)(node,CM_BLOCK);
                node = TY_(InferredTag)(doc, TidyTag_LI);
                /* Add "display: inline" to avoid a blank line after <li> with 
                   Internet Explorer. See http://tidy.sf.net/issue/836462 */
                TY_(AddStyleProperty)( doc, node,
                                       wasblock
                                       ? "list-style: none; display: inline"
                                       : "list-style: none" 
                                       );
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(InsertNodeAtEnd)(list,node);
            }
        }

        ParseTag( doc, node, IgnoreWhitespace);
    }

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
#if defined(ENABLE_DEBUG_LOG)
    in_parse_list--;
    SPRTF("Exit ParseList 6 %d... missing end tag\n",in_parse_list);
#endif
}